

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

bool __thiscall
absl::lts_20240722::container_internal::
btree_node<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
::is_ordered_correctly<std::less<std::pair<google::protobuf::Descriptor_const*,int>>>
          (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<google::protobuf::Descriptor_const*,int>,google::protobuf::FieldDescriptor_const*,std::less<std::pair<google::protobuf::Descriptor_const*,int>>,std::allocator<std::pair<std::pair<google::protobuf::Descriptor_const*,int>const,google::protobuf::FieldDescriptor_const*>>,256,false>>
           *this,field_type i,less<std::pair<const_google::protobuf::Descriptor_*,_int>_> *comp)

{
  byte a;
  byte bVar1;
  int iVar2;
  int iVar3;
  anon_class_16_2_3ef9e608 compare;
  
  compare.comp = comp;
  compare.this = (btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                  *)this;
  a = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
      ::start((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
               *)this);
  iVar3 = -1;
  for (; bVar1 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                 ::finish((btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
                           *)this), a < bVar1; a = a + 1) {
    if (i == a) {
      if (0 < iVar3) break;
    }
    else {
      iVar2 = btree_node<absl::lts_20240722::container_internal::map_params<std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_256,_false>_>
              ::
              is_ordered_correctly<std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>_>
              ::anon_class_16_2_3ef9e608::operator()(&compare,a,i);
      if ((iVar2 < iVar3) || (iVar3 = iVar2, iVar2 == 0)) break;
    }
  }
  return bVar1 <= a;
}

Assistant:

bool is_ordered_correctly(field_type i, const Compare &comp) const {
    if (std::is_base_of<BtreeTestOnlyCheckedCompareOptOutBase,
                        Compare>::value ||
        params_type::kIsKeyCompareStringAdapted) {
      return true;
    }

    const auto compare = [&](field_type a, field_type b) {
      const absl::weak_ordering cmp =
          compare_internal::do_three_way_comparison(comp, key(a), key(b));
      return cmp < 0 ? -1 : cmp > 0 ? 1 : 0;
    };
    int cmp = -1;
    constexpr bool kCanHaveEquivKeys =
        params_type::template can_have_multiple_equivalent_keys<key_type>();
    for (field_type j = start(); j < finish(); ++j) {
      if (j == i) {
        if (cmp > 0) return false;
        continue;
      }
      int new_cmp = compare(j, i);
      if (new_cmp < cmp || (!kCanHaveEquivKeys && new_cmp == 0)) return false;
      cmp = new_cmp;
    }
    return true;
  }